

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall crnlib::dxt1_endpoint_optimizer::compute_selectors_hc(dxt1_endpoint_optimizer *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  color_quad_u8 *e1;
  long lVar10;
  ulong uVar11;
  color_quad_u8 c3;
  color_quad_u8 c2;
  color_quad_u8 c1;
  color_quad_u8 c0;
  
  vector<unsigned_char>::resize
            (&(this->m_best_solution).m_selectors,(this->m_unique_colors).m_size,false);
  if ((this->m_best_solution).m_enforce_selector == true) {
    memset((this->m_best_solution).m_selectors.m_p,(uint)(this->m_best_solution).m_enforced_selector
           ,(ulong)(this->m_best_solution).m_selectors.m_size);
    return;
  }
  dxt1_block::unpack_color((dxt1_block *)&c0,(this->m_best_solution).m_coords.m_low_color,true,0xff)
  ;
  dxt1_block::unpack_color
            ((dxt1_block *)&c1,(this->m_best_solution).m_coords.m_high_color,true,0xff);
  bVar1 = (this->m_best_solution).m_alternate_rounding;
  c2.field_0.field_0.r =
       (uchar)(((uint)c1.field_0.field_0.r + (uint)c0.field_0.field_0.r * 2 + (uint)bVar1) / 3);
  c2.field_0.field_0.g =
       (uchar)((ushort)((ushort)c1.field_0.field_0.g + (ushort)bVar1 +
                       (ushort)c0.field_0.field_0.g * 2) / 3);
  c2.field_0.field_0.b =
       (uchar)((ushort)((ushort)c1.field_0.field_0.b + (ushort)bVar1 +
                       (ushort)c0.field_0.field_0.b * 2) / 3);
  lVar10 = 0;
  c2.field_0.field_0.a = '\0';
  c3.field_0.field_0.g =
       (uchar)(((uint)c0.field_0.field_0.g + (uint)bVar1 + (uint)c1.field_0.field_0.g * 2) / 3);
  c3.field_0.field_0.r =
       (uchar)(((uint)c0.field_0.field_0.r + (uint)c1.field_0.field_0.r * 2 + (uint)bVar1) / 3);
  c3.field_0.field_0.b =
       (uchar)((ushort)((ushort)c0.field_0.field_0.b + (ushort)bVar1 +
                       (ushort)c1.field_0.field_0.b * 2) / 3);
  c3.field_0.field_0.a = '\0';
  uVar2 = (this->m_unique_colors).m_size;
  for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
    e1 = (color_quad_u8 *)((long)&(((this->m_unique_colors).m_p)->m_color).field_0 + lVar10);
    uVar5 = crnlib::color::color_distance(this->m_perceptual,e1,&c0,false);
    uVar6 = crnlib::color::color_distance(this->m_perceptual,e1,&c1,false);
    uVar7 = crnlib::color::color_distance(this->m_perceptual,e1,&c2,false);
    uVar8 = crnlib::color::color_distance(this->m_perceptual,e1,&c3,false);
    uVar3 = uVar6;
    if (uVar5 < uVar6) {
      uVar3 = uVar5;
    }
    uVar9 = uVar8;
    if (uVar7 < uVar8) {
      uVar9 = uVar7;
    }
    bVar4 = uVar8 < uVar7 | 2;
    if (uVar3 <= uVar9) {
      bVar4 = uVar6 < uVar5;
    }
    (this->m_best_solution).m_selectors.m_p[uVar11] = bVar4;
    lVar10 = lVar10 + 8;
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_selectors_hc()
    {
        m_best_solution.m_selectors.resize(m_unique_colors.size());
        if (m_best_solution.m_enforce_selector)
        {
            memset(m_best_solution.m_selectors.get_ptr(), m_best_solution.m_enforced_selector, m_best_solution.m_selectors.size());
            return;
        }
        color_quad_u8 c0 = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + m_best_solution.m_alternate_rounding) / 3, (c0.g * 2 + c1.g + m_best_solution.m_alternate_rounding) / 3, (c0.b * 2 + c1.b + m_best_solution.m_alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + m_best_solution.m_alternate_rounding) / 3, (c1.g * 2 + c0.g + m_best_solution.m_alternate_rounding) / 3, (c1.b * 2 + c0.b + m_best_solution.m_alternate_rounding) / 3, 0);
        for (uint i = 0, iEnd = m_unique_colors.size(); i < iEnd; i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            uint e0 = color::color_distance(m_perceptual, c, c0, false);
            uint e1 = color::color_distance(m_perceptual, c, c1, false);
            uint e2 = color::color_distance(m_perceptual, c, c2, false);
            uint e3 = color::color_distance(m_perceptual, c, c3, false);
            uint e01 = math::minimum(e0, e1);
            uint e23 = math::minimum(e2, e3);
            m_best_solution.m_selectors[i] = e01 <= e23 ? e01 == e0 ? 0 : 1 : e23 == e2 ? 2
                                                                                        : 3;
        }
    }